

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_instanceof(ExecutionEngine *this)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  ushort index;
  int iVar4;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar5;
  cp_info **ppcVar6;
  char *pcVar7;
  ClassRuntime *this_02;
  ClassFile *pCVar8;
  anon_union_8_10_52016fac_for_data aVar9;
  Value VVar10;
  allocator local_a1;
  Frame *local_a0;
  MethodArea *local_98;
  string className;
  string currClassName;
  string superClassName;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  local_98 = MethodArea::getInstance();
  puVar5 = Frame::getCode(this_01,this_01->pc);
  index = *(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8;
  ppcVar6 = Frame::getConstantPool(this_01);
  if ((*ppcVar6)[(ulong)index - 1].tag != '\a') {
    __assert_fail("cpElement.tag == CONSTANT_Class",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c3,"void ExecutionEngine::i_instanceof()");
  }
  pcVar7 = getFormattedConstant(*ppcVar6,index);
  std::__cxx11::string::string((string *)&className,pcVar7,(allocator *)&currClassName);
  VVar10 = Frame::popTopOfOperandStack(this_01);
  aVar9 = VVar10.data;
  if (VVar10.type != REFERENCE) {
    __assert_fail("objectrefValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x11c7,"void ExecutionEngine::i_instanceof()");
  }
  if (aVar9 == (ClassInstance *)0x0) {
    aVar9.longValue = 0;
  }
  else {
    iVar4 = (**((Object *)&(aVar9.object)->_vptr_Object)->_vptr_Object)(aVar9.longValue);
    if (iVar4 == 0) {
      local_a0 = this_01;
      this_02 = ClassInstance::getClassRuntime((ClassInstance *)aVar9.object);
      bVar2 = false;
      do {
        if (bVar2) break;
        pCVar8 = ClassRuntime::getClassFile(this_02);
        pcVar7 = getFormattedConstant(pCVar8->constant_pool,pCVar8->this_class);
        std::__cxx11::string::string((string *)&currClassName,pcVar7,(allocator *)&superClassName);
        _Var3 = std::operator==(&currClassName,&className);
        bVar1 = true;
        if (_Var3) {
          bVar2 = true;
        }
        else if (pCVar8->super_class == 0) {
          bVar1 = false;
        }
        else {
          pcVar7 = getFormattedConstant(pCVar8->constant_pool,pCVar8->this_class);
          std::__cxx11::string::string((string *)&superClassName,pcVar7,&local_a1);
          this_02 = MethodArea::loadClassNamed(local_98,&superClassName);
          std::__cxx11::string::~string((string *)&superClassName);
        }
        std::__cxx11::string::~string((string *)&currClassName);
      } while (bVar1);
      aVar9.longValue._1_7_ = 0;
      aVar9.booleanValue = bVar2;
      this_01 = local_a0;
    }
    else {
      iVar4 = (**((Object *)&(aVar9.object)->_vptr_Object)->_vptr_Object)(aVar9.longValue);
      if (iVar4 == 1) {
        bVar2 = std::operator==(&className,"java/lang/String");
        if (bVar2) {
          aVar9.longValue = 1;
          goto LAB_001237df;
        }
      }
      bVar2 = std::operator==(&className,"java/lang/Object");
      aVar9.longValue._1_7_ = 0;
      aVar9.booleanValue = bVar2;
    }
  }
LAB_001237df:
  VVar10.data.longValue = aVar9.longValue;
  VVar10.printType = BOOLEAN;
  VVar10.type = INT;
  Frame::pushIntoOperandStack(this_01,VVar10);
  this_01->pc = this_01->pc + 3;
  std::__cxx11::string::~string((string *)&className);
  return;
}

Assistant:

void ExecutionEngine::i_instanceof() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    MethodArea &methodArea = MethodArea::getInstance();

    u1 *code = topFrame->getCode(topFrame->pc);
    u1 byte1 = code[1];
    u1 byte2 = code[2];
    
    u2 cpIndex = (byte1 << 8) | byte2;
    cp_info *constantPool = *(topFrame->getConstantPool());
    cp_info cpElement = constantPool[cpIndex-1];
    assert(cpElement.tag == CONSTANT_Class);
    string className = getFormattedConstant(constantPool, cpIndex);
    
    Value objectrefValue = topFrame->popTopOfOperandStack();
    assert(objectrefValue.type == ValueType::REFERENCE);
    
    Value resultValue;
    resultValue.type = ValueType::INT;

    if (objectrefValue.data.object == NULL) {
        resultValue.data.intValue = 0;
    } else {
        Object *obj = objectrefValue.data.object;
        
        if (obj->objectType() == ObjectType::CLASS_INSTANCE) {
            ClassInstance *classInstance = (ClassInstance *) obj;
            ClassRuntime *classRuntime = classInstance->getClassRuntime();
            
            bool found = false;
            while (!found) {
                ClassFile *classFile = classRuntime->getClassFile();
                string currClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                
                if (currClassName == className) {
                    found = true;
                } else {
                    if (classFile->super_class == 0) {
                        break;
                    } else {
                        string superClassName = getFormattedConstant(classFile->constant_pool, classFile->this_class);
                        classRuntime = methodArea.loadClassNamed(superClassName);
                    }
                }
            }
            
            resultValue.data.intValue = found ? 1 : 0;
        } else if (obj->objectType() == ObjectType::STRING_INSTANCE) {
            resultValue.data.intValue = (className == "java/lang/String" || className == "java/lang/Object") ? 1 : 0;
        } else {
            if (className == "java/lang/Object") {
                resultValue.data.intValue = 1;
            } else {
                resultValue.data.intValue = 0;
            }
        }
    }
    
    topFrame->pushIntoOperandStack(resultValue);
    
    topFrame->pc += 3;
}